

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O1

IVec2 (*) [4] glu::getDefaultGatherOffsets(void)

{
  if (getDefaultGatherOffsets()::s_defaultOffsets == '\0') {
    getDefaultGatherOffsets();
  }
  return &getDefaultGatherOffsets::s_defaultOffsets;
}

Assistant:

const tcu::IVec2 (&getDefaultGatherOffsets (void))[4]
{
	static const tcu::IVec2 s_defaultOffsets[4] =
	{
		tcu::IVec2(0, 1),
		tcu::IVec2(1, 1),
		tcu::IVec2(1, 0),
		tcu::IVec2(0, 0),
	};
	return s_defaultOffsets;
}